

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

treeNode * declareSequence(void)

{
  bool bVar1;
  treeNode *ptVar2;
  treeNode *ptVar3;
  allocator local_59;
  treeNode *local_58;
  string local_50;
  
  local_58 = declare();
  ptVar3 = local_58;
  while( true ) {
    std::__cxx11::string::string((string *)&local_50,",",&local_59);
    bVar1 = match(&local_50,Empty);
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar1) break;
    ptVar2 = declare();
    ptVar3->sibling = ptVar2;
    ptVar3 = ptVar2;
  }
  return local_58;
}

Assistant:

treeNode* declareSequence()
{
    auto ret = declare();
    auto p=ret;
    while(match(","))
    {
        p->sibling=declare();
        p=p->sibling;
    }
    return ret;
}